

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteStreamTest_AllLite29_Test::TestBody
          (LiteStreamTest_AllLite29_Test *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  string_view data_00;
  void *data_1;
  size_t size;
  string data;
  ArrayOutputStream array_stream;
  CodedOutputStream output_stream;
  TestMapLite message1;
  TestMapLite message2;
  AssertHelper local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_598;
  undefined1 local_590 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  AssertHelper local_570;
  size_t local_568;
  char *local_560;
  size_t local_558;
  char local_550;
  undefined7 uStack_54f;
  undefined1 local_540 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  undefined1 local_520 [48];
  ArrayOutputStream *local_4f0;
  undefined2 local_4e8;
  bool local_4e6;
  bool local_4e5;
  uint8_t *local_4e0;
  int64_t local_4d8;
  TestMapLite local_4d0;
  TestMapLite local_278;
  
  proto2_unittest::TestMapLite::TestMapLite(&local_4d0,(Arena *)0x0);
  proto2_unittest::TestMapLite::TestMapLite(&local_278,(Arena *)0x0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>(&local_4d0);
  local_568 = proto2_unittest::TestMapLite::ByteSizeLong(&local_4d0);
  local_558 = 0;
  local_550 = '\0';
  local_560 = &local_550;
  std::__cxx11::string::resize((ulong)&local_560,(char)local_568);
  io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)local_540,local_560,(int)local_568,1);
  local_4e6 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_520 + 0x10;
  local_4e8._0_1_ = false;
  local_4e8._1_1_ = false;
  local_4e5 = false;
  local_520._0_8_ = puVar1;
  local_520._8_8_ = puVar1;
  local_4f0 = (ArrayOutputStream *)local_540;
  local_4e0 = puVar1;
  local_4d8 = io::ArrayOutputStream::ByteCount((ArrayOutputStream *)local_540);
  bVar3 = io::ArrayOutputStream::Next
                    ((ArrayOutputStream *)local_540,(void **)local_590,(int *)&local_5a8);
  if (bVar3 && 0 < (int)(uint)local_5a8.data_) {
    puVar2 = (uint8_t *)CONCAT71(local_590._1_7_,local_590[0]);
    local_4e0 = puVar2;
    local_520._8_8_ = (uint8_t *)0x0;
    local_520._0_8_ = puVar2 + -0x10;
    if ((uint)local_5a8.data_ < 0x11) {
      local_4e0 = puVar1;
      local_520._8_8_ = puVar2;
      local_520._0_8_ = puVar1;
    }
    local_520._0_8_ = local_520._0_8_ + (ulong)(uint)local_5a8.data_;
  }
  iVar4 = (*local_4d0.super_MessageLite._vptr_MessageLite[5])(&local_4d0,local_4e0,local_520);
  local_4e0 = (uint8_t *)CONCAT44(extraout_var,iVar4);
  bVar3 = io::CodedOutputStream::HadError((CodedOutputStream *)local_520);
  local_5a8.data_._0_4_ = CONCAT31(local_5a8.data_._1_3_,!bVar3);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_590,(internal *)&local_5a8,
               (AssertionResult *)"output_stream.HadError()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2cd,(char *)CONCAT71(local_590._1_7_,local_590[0]));
    testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_590._1_7_,local_590[0]) != &local_580) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_590._1_7_,local_590[0]),local_580._M_allocated_capacity + 1)
      ;
    }
    if (local_598._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_598._M_head_impl + 8))();
    }
    if (local_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_5a0,local_5a0);
    }
  }
  iVar5 = io::EpsCopyOutputStream::ByteCount((EpsCopyOutputStream *)local_520,local_4e0);
  local_5a8.data_._0_4_ = (int)iVar5 - (int)local_4d8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_590,"size","output_stream.ByteCount()",&local_568,(int *)&local_5a8);
  if (local_590[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5a8);
    if (local_588 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_588->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2ce,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_598,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_598);
    if ((long *)CONCAT44(local_5a8.data_._4_4_,(uint)local_5a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_5a8.data_._4_4_,(uint)local_5a8.data_) + 8))();
    }
  }
  if (local_588 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_588,local_588);
  }
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_520);
  data_00._M_str = local_560;
  data_00._M_len = local_558;
  local_540[0] = (internal)MessageLite::ParseFromString(&local_278.super_MessageLite,data_00);
  local_538 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_540[0]) {
    testing::Message::Message((Message *)local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_520,(internal *)local_540,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2d0,(char *)local_520._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((uint8_t *)local_520._0_8_ != puVar1) {
      operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_590._1_7_,local_590[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_590._1_7_,local_590[0]) + 8))();
    }
    if (local_538 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_538,local_538);
    }
  }
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&local_278);
  if (local_560 != &local_550) {
    operator_delete(local_560,CONCAT71(uStack_54f,local_550) + 1);
  }
  proto2_unittest::TestMapLite::~TestMapLite(&local_278);
  proto2_unittest::TestMapLite::~TestMapLite(&local_4d0);
  return;
}

Assistant:

TEST(LiteStreamTest, AllLite29) {
  {
    // Test the generated SerializeWithCachedSizes()
    proto2_unittest::TestMapLite message1, message2;
    MapTestUtil::SetMapFields(&message1);
    size_t size = message1.ByteSizeLong();
    std::string data;
    data.resize(size);
    {
      // Allow the output stream to buffer only one byte at a time.
      io::ArrayOutputStream array_stream(&data[0], size, 1);
      io::CodedOutputStream output_stream(&array_stream);
      message1.SerializeWithCachedSizes(&output_stream);
      EXPECT_FALSE(output_stream.HadError());
      EXPECT_EQ(size, output_stream.ByteCount());
    }
    EXPECT_TRUE(message2.ParseFromString(data));
    MapTestUtil::ExpectMapFieldsSet(message2);
  }
}